

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O1

logical ga_locate_nnodes_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,
                         Integer *np)

{
  logical lVar1;
  Integer hi [2];
  Integer lo [2];
  Integer local_28;
  Integer local_20;
  Integer local_18;
  Integer local_10;
  
  local_18 = *ilo;
  local_10 = *jlo;
  local_28 = *ihi;
  local_20 = *jhi;
  lVar1 = pnga_locate_nnodes(*g_a,&local_18,&local_28,np);
  return lVar1;
}

Assistant:

logical FATR ga_locate_nnodes_( Integer *g_a,
                                Integer *ilo,
                                Integer *ihi,
                                Integer *jlo,
                                Integer *jhi,
                                Integer *np)
{
  Integer lo[2], hi[2];
  lo[0] = *ilo;
  lo[1] = *jlo;
  hi[0] = *ihi;
  hi[1] = *jhi;
  return wnga_locate_nnodes(*g_a, lo, hi, np);
}